

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

int __thiscall FStateLabelStorage::AddPointer(FStateLabelStorage *this,FState *ptr)

{
  uint uVar1;
  uchar *puVar2;
  int pos;
  FState *ptr_local;
  FStateLabelStorage *this_local;
  
  if (ptr == (FState *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = TArray<unsigned_char,_unsigned_char>::Reserve(&this->Storage,0xc);
    puVar2 = TArray<unsigned_char,_unsigned_char>::operator[](&this->Storage,(long)(int)uVar1);
    memset(puVar2,0,4);
    puVar2 = TArray<unsigned_char,_unsigned_char>::operator[](&this->Storage,(long)(int)uVar1 + 4);
    *(FState **)puVar2 = ptr;
    this_local._4_4_ = (int)uVar1 / 4 + 1;
  }
  return this_local._4_4_;
}

Assistant:

int AddPointer(FState *ptr)
	{
		if (ptr != nullptr)
		{
			int pos = Storage.Reserve(sizeof(ptr) + sizeof(int));
			memset(&Storage[pos], 0, sizeof(int));
			memcpy(&Storage[pos + sizeof(int)], &ptr, sizeof(ptr));
			return pos / 4 + 1;
		}
		else return 0;
	}